

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  pointer pbVar3;
  ulong uVar4;
  MatchResultListener *pMVar5;
  pointer pcVar6;
  ulong uVar7;
  pointer pcVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_78;
  char *local_70;
  vector<char,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_38 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_50,*(size_type *)matrix,(value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,*(size_type *)(matrix + 8),(value_type *)&local_78,
             (allocator_type *)&local_70);
  uVar10 = *(ulong *)matrix;
  if (uVar10 != 0) {
    uVar7 = *(ulong *)(matrix + 8);
    uVar4 = 0;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar10 = 0;
        do {
          bVar12 = *(char *)(uVar10 + uVar7 * uVar4 + *(long *)(matrix + 0x10)) == '\x01';
          local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] =
               local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] | bVar12;
          pbVar1 = (byte *)(CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar10);
          *pbVar1 = *pbVar1 | bVar12;
          uVar10 = uVar10 + 1;
          uVar7 = *(ulong *)(matrix + 8);
        } while (uVar10 < uVar7);
        uVar10 = *(ulong *)matrix;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar10);
  }
  uVar9 = *(uint *)this;
  bVar12 = true;
  if ((uVar9 & 1) != 0) {
    local_78 = "where the following matchers don\'t match any elements:\n";
    pcVar6 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,
                               local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._0_1_);
    bVar12 = true;
    if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish != pcVar6) {
      uVar10 = 0;
      pcVar8 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pcVar6[uVar10] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar5 = MatchResultListener::operator<<(listener,&local_78);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x15e8e9);
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            MatchResultListener::operator<<(pMVar5,(char (*) [3])0x1599e5);
            plVar2 = *(long **)(*(long *)(this + 8) + uVar10 * 8);
            (**(code **)(*plVar2 + 0x10))(plVar2,listener->stream_);
            local_78 = ",\n";
            pcVar6 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_68.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_1_);
            pcVar8 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          bVar12 = false;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)pcVar8 - (long)pcVar6));
      uVar9 = *(uint *)this;
    }
  }
  if ((uVar9 & 2) != 0) {
    local_78 = "where the following elements don\'t match any matchers:\n";
    local_70 = "\nand ";
    if (bVar12) {
      local_70 = "";
    }
    if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar11 = 8;
      uVar10 = 0;
      pcVar6 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar8 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pcVar6[uVar10] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar5 = MatchResultListener::operator<<(listener,&local_70);
            pMVar5 = MatchResultListener::operator<<(pMVar5,&local_78);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x15e6a3);
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x1599e5);
            if (pMVar5->stream_ != (ostream *)0x0) {
              pbVar3 = (local_38->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar5->stream_,*(char **)((long)pbVar3 + lVar11 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar11));
            }
            local_78 = ",\n";
            local_70 = "";
            pcVar6 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar8 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          bVar12 = false;
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar10 < (ulong)((long)pcVar8 - (long)pcVar6));
    }
  }
  if ((void *)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}